

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O2

void __thiscall
de::details::UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::reset
          (UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> *this)

{
  Buffer *ptr;
  
  ptr = (this->m_data).ptr;
  if (ptr != (Buffer *)0x0) {
    DefaultDeleter<vkt::pipeline::Buffer>::operator()
              ((DefaultDeleter<vkt::pipeline::Buffer> *)&(this->m_data).field_0x8,ptr);
    (this->m_data).ptr = (Buffer *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}